

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O0

void dwarf_dealloc_dnames(Dwarf_Dnames_Head dn)

{
  Dwarf_Dnames_Head dn_local;
  
  if ((dn != (Dwarf_Dnames_Head)0x0) && (dn->dn_magic == 0xabcd)) {
    _dwarf_internal_dwarf_dealloc_dnames(dn);
    dwarf_dealloc(dn->dn_dbg,dn,0x3f);
  }
  return;
}

Assistant:

void
dwarf_dealloc_dnames(Dwarf_Dnames_Head dn)
{
    if (!dn || dn->dn_magic != DWARF_DNAMES_MAGIC) {
        return;
    }
    _dwarf_internal_dwarf_dealloc_dnames(dn);
    /*  Now dn_magic 0 so the dwarf_dealloc
        will just do the base record free. */
    dwarf_dealloc(dn->dn_dbg,dn,DW_DLA_DNAMES_HEAD);
}